

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O1

ParseFlagMap * csv::internals::make_parse_flags(ParseFlagMap *__return_storage_ptr__,char delimiter)

{
  long lVar1;
  undefined7 in_register_00000031;
  ParseFlags PVar2;
  long lVar3;
  
  lVar3 = 0;
  memset(__return_storage_ptr__,0,0x400);
  lVar1 = 0x8a000000;
  do {
    PVar2 = (uint)(lVar1 == 0) * 3 + NOT_SPECIAL;
    if (lVar1 == -0x3000000) {
      PVar2 = NEWLINE;
    }
    if ((long)(int)CONCAT71(in_register_00000031,delimiter) + 0x80 == lVar3) {
      PVar2 = DELIMITER;
    }
    __return_storage_ptr__->_M_elems[lVar3] = PVar2;
    lVar3 = lVar3 + 1;
    lVar1 = lVar1 + -0x1000000;
  } while (lVar1 != -0x76000000);
  return __return_storage_ptr__;
}

Assistant:

HEDLEY_CONST CONSTEXPR_17 ParseFlagMap make_parse_flags(char delimiter) {
            std::array<ParseFlags, 256> ret = {};
            for (int i = -128; i < 128; i++) {
                const int arr_idx = i + 128;
                char ch = char(i);

                if (ch == delimiter)
                    ret[arr_idx] = ParseFlags::DELIMITER;
                else if (ch == '\r' || ch == '\n')
                    ret[arr_idx] = ParseFlags::NEWLINE;
                else
                    ret[arr_idx] = ParseFlags::NOT_SPECIAL;
            }

            return ret;
        }